

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O0

ARTConflictType
duckdb::Prefix::Insert
          (ART *art,Node *node,ARTKey *key,idx_t depth,ARTKey *row_id,GateStatus status,
          optional_ptr<duckdb::ART,_true> delete_art,IndexAppendMode append_mode)

{
  bool bVar1;
  uint8_t uVar2;
  GateStatus GVar3;
  optional_idx row_id_00;
  idx_t iVar4;
  Node *pNVar5;
  ART *in_RCX;
  optional_ptr<duckdb::ART,_true> in_RDX;
  reference<Node> *in_RSI;
  IndexPointer in_RDI;
  Node *in_R8;
  char in_R9B;
  undefined8 in_stack_00000008;
  idx_t count;
  reference<Node> ref;
  Node leaf;
  Node new_row_id;
  GateStatus split_status;
  uint8_t byte;
  Node remainder;
  optional_idx pos;
  reference<Node> next;
  ARTKey *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  ART *in_stack_ffffffffffffff08;
  ART *in_stack_ffffffffffffff10;
  Node *in_stack_ffffffffffffff18;
  uint8_t byte_00;
  ART *in_stack_ffffffffffffff20;
  ART *in_stack_ffffffffffffff28;
  optional_idx *in_stack_ffffffffffffff40;
  ART *this;
  ART *art_00;
  ART *key_00;
  reference<Node> *in_stack_ffffffffffffff58;
  ART *in_stack_ffffffffffffff60;
  uint8_t in_stack_ffffffffffffff8f;
  undefined6 in_stack_ffffffffffffff98;
  Node *in_stack_ffffffffffffffa0;
  IndexPointer child;
  reference_wrapper<duckdb::Node> in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  IndexAppendMode in_stack_fffffffffffffff8;
  ARTConflictType local_1;
  
  ::std::reference_wrapper<duckdb::Node>::reference_wrapper<duckdb::Node&,void,duckdb::Node*>
            ((reference_wrapper<duckdb::Node> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (Node *)in_stack_fffffffffffffef8);
  row_id_00 = TraverseMutable(in_stack_ffffffffffffff08,
                              (reference<Node> *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              in_stack_fffffffffffffef8,(idx_t *)0x18d3ddb);
  bVar1 = optional_idx::IsValid((optional_idx *)&stack0xffffffffffffffb0);
  if (bVar1) {
    Node::Node((Node *)0x18d3e86);
    this = (ART *)in_RDI.data;
    ::std::reference_wrapper::operator_cast_to_Node_((reference_wrapper<duckdb::Node> *)0x18d3ea0);
    iVar4 = optional_idx::GetIndex(in_stack_ffffffffffffff40);
    UnsafeNumericCast<unsigned_char,unsigned_long,void>(iVar4);
    uVar2 = GetByte(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                    (uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x38));
    byte_00 = (uint8_t)((ulong)in_stack_ffffffffffffff18 >> 0x38);
    art_00 = this;
    iVar4 = optional_idx::GetIndex((optional_idx *)this);
    UnsafeNumericCast<unsigned_char,unsigned_long,void>(iVar4);
    GVar3 = Split(art_00,in_RSI,(Node *)in_RDX.ptr,(uint8_t)((ulong)in_RCX >> 0x38));
    key_00 = art_00;
    ::std::reference_wrapper::operator_cast_to_Node_((reference_wrapper<duckdb::Node> *)0x18d3f33);
    BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New
              (in_stack_ffffffffffffff10,(Node *)in_stack_ffffffffffffff08);
    ::std::reference_wrapper<duckdb::Node>::get
              ((reference_wrapper<duckdb::Node> *)&stack0xffffffffffffffb8);
    Node::SetGateStatus((Node *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        (GateStatus)((ulong)in_stack_fffffffffffffef8 >> 0x38));
    ::std::reference_wrapper::operator_cast_to_Node_((reference_wrapper<duckdb::Node> *)0x18d3f77);
    child.data = (idx_t)in_stack_ffffffffffffffa0;
    Node4::InsertChild(in_stack_ffffffffffffff28,(Node *)in_stack_ffffffffffffff20,byte_00,
                       (Node)in_RDI.data);
    if (in_R9B == '\x01') {
      Node::Node((Node *)0x18d3fc1);
      ARTKey::GetRowId((ARTKey *)0x18d3fce);
      Leaf::New((Node *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                (row_t)in_stack_fffffffffffffef8);
      ::std::reference_wrapper::operator_cast_to_Node_((reference_wrapper<duckdb::Node> *)0x18d3ff8)
      ;
      ARTKey::operator[]((ARTKey *)in_RDX.ptr,(idx_t)in_RCX);
      Node::InsertChild((ART *)CONCAT17(uVar2,CONCAT16(GVar3,in_stack_ffffffffffffff98)),
                        in_stack_ffffffffffffffa0,in_stack_ffffffffffffff8f,(Node)child.data);
      local_1 = NO_CONFLICT;
    }
    else {
      Node::Node((Node *)0x18d4058);
      ::std::reference_wrapper<duckdb::Node>::reference_wrapper<duckdb::Node&,void,duckdb::Node*>
                ((reference_wrapper<duckdb::Node> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (Node *)in_stack_fffffffffffffef8);
      if ((_func_int **)((long)&(in_RCX->super_BoundIndex).super_Index._vptr_Index + 1U) <
          ((in_RDX.ptr)->super_BoundIndex).super_Index._vptr_Index) {
        New(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(ARTKey *)key_00,(idx_t)art_00,
            (idx_t)this);
      }
      ::std::reference_wrapper::operator_cast_to_Node_((reference_wrapper<duckdb::Node> *)0x18d40d4)
      ;
      ARTKey::GetRowId((ARTKey *)0x18d40e6);
      Leaf::New((Node *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                (row_t)in_stack_fffffffffffffef8);
      pNVar5 = ::std::reference_wrapper::operator_cast_to_Node_
                         ((reference_wrapper<duckdb::Node> *)0x18d410d);
      uVar2 = (uint8_t)((ulong)pNVar5 >> 0x38);
      ARTKey::operator[]((ARTKey *)in_RDX.ptr,(idx_t)in_RCX);
      Node4::InsertChild(in_stack_ffffffffffffff28,(Node *)in_stack_ffffffffffffff20,uVar2,
                         (Node)in_RDI.data);
      local_1 = NO_CONFLICT;
    }
  }
  else {
    ::std::reference_wrapper::operator_cast_to_Node_((reference_wrapper<duckdb::Node> *)0x18d3e12);
    local_1 = ART::Insert(in_RCX,in_R8,(ARTKey *)CONCAT17(in_R9B,in_stack_ffffffffffffffc0),
                          (idx_t)in_stack_ffffffffffffffb8._M_data,(ARTKey *)row_id_00.index,
                          (GateStatus)((ulong)in_stack_00000008 >> 0x38),in_RDX,
                          in_stack_fffffffffffffff8);
  }
  return local_1;
}

Assistant:

ARTConflictType Prefix::Insert(ART &art, Node &node, const ARTKey &key, idx_t depth, const ARTKey &row_id,
                               const GateStatus status, optional_ptr<ART> delete_art,
                               const IndexAppendMode append_mode) {
	reference<Node> next(node);
	auto pos = TraverseMutable(art, next, key, depth);

	// We recurse into the next node, if
	// (1) the prefix matches the key.
	// (2) we reach a gate.
	if (!pos.IsValid()) {
		D_ASSERT(next.get().GetType() != NType::PREFIX || next.get().GetGateStatus() == GateStatus::GATE_SET);
		return art.Insert(next, key, depth, row_id, status, delete_art, append_mode);
	}

	Node remainder;
	auto byte = GetByte(art, next, UnsafeNumericCast<uint8_t>(pos.GetIndex()));
	auto split_status = Split(art, next, remainder, UnsafeNumericCast<uint8_t>(pos.GetIndex()));
	Node4::New(art, next);
	next.get().SetGateStatus(split_status);

	// Insert the remaining prefix into the new Node4.
	Node4::InsertChild(art, next, byte, remainder);

	if (status == GateStatus::GATE_SET) {
		D_ASSERT(pos.GetIndex() != ROW_ID_COUNT);
		Node new_row_id;
		Leaf::New(new_row_id, key.GetRowId());
		Node::InsertChild(art, next, key[depth], new_row_id);
		return ARTConflictType::NO_CONFLICT;
	}

	Node leaf;
	reference<Node> ref(leaf);
	if (depth + 1 < key.len) {
		// Create the prefix.
		auto count = key.len - depth - 1;
		Prefix::New(art, ref, key, depth + 1, count);
	}

	// Create the inlined leaf.
	Leaf::New(ref, row_id.GetRowId());
	Node4::InsertChild(art, next, key[depth], leaf);
	return ARTConflictType::NO_CONFLICT;
}